

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall Image::Image(Image *this,uint width,uint height)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uchar *puVar1;
  int in_EDX;
  int in_ESI;
  allocator_type *in_RDI;
  undefined1 *__n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  undefined1 local_2a;
  undefined1 local_29;
  int local_10;
  int local_c;
  
  *(undefined8 *)in_RDI = 0;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11a4b0);
  *(int *)(in_RDI + 0x20) = local_c;
  *(int *)(in_RDI + 0x24) = local_10;
  *(undefined4 *)(in_RDI + 0x28) = 4;
  *(undefined8 *)(in_RDI + 0x30) = 0x3ff0000000000000;
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            (ulong)(uint)(local_c * local_10 * 4);
  local_29 = 0xff;
  __n = &local_2a;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x11a4ff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffffc0,(size_type)__n,(value_type *)this_00,in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x11a541);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11a54f);
  *(uchar **)in_RDI = puVar1;
  return;
}

Assistant:

Image::Image(unsigned int width, unsigned int height) : width(width), height(height) {
  // Zero-initialize the image.
  raw = std::vector<unsigned char>(width * height * 4, 255);
  // Set the pixel pointer to the start of the raw buffer
  pixels = reinterpret_cast<Pixel *>(raw.data());
}